

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_mus_midiout.cpp
# Opt level: O0

void __thiscall MUSSong2::MUSSong2(MUSSong2 *this,FileReader *reader,EMidiDevice type,char *args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  MUSHeader *pMVar5;
  undefined4 extraout_var_00;
  int len;
  BYTE local_48 [4];
  int start;
  BYTE front [32];
  char *args_local;
  EMidiDevice type_local;
  FileReader *reader_local;
  MUSSong2 *this_local;
  
  front._24_8_ = args;
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__MUSSong2_009f0458;
  this->MusHeader = (MUSHeader *)0x0;
  this->MusBuffer = (BYTE *)0x0;
  iVar1 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,local_48,0x20);
  if ((CONCAT44(extraout_var,iVar1) == 0x20) && (iVar1 = MUSHeaderSearch(local_48,0x20), -1 < iVar1)
     ) {
    lVar4 = FileReader::GetLength(reader);
    iVar2 = (int)lVar4 - iVar1;
    if (7 < iVar2) {
      pMVar5 = (MUSHeader *)operator_new__((long)iVar2);
      this->MusHeader = pMVar5;
      memcpy(this->MusHeader,local_48 + iVar1,0x20 - (long)iVar1);
      iVar3 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                        (reader,(long)this->MusHeader + (0x20 - (long)iVar1),
                         (long)iVar1 + -0x20 + (long)iVar2);
      if ((CONCAT44(extraout_var_00,iVar3) == (long)(iVar2 - (0x20 - iVar1))) &&
         (this->MusHeader->NumChans < 0x10)) {
        this->MusBuffer =
             (BYTE *)((long)&this->MusHeader->Magic + (ulong)this->MusHeader->SongStart);
        iVar1 = MIN<int>((uint)this->MusHeader->SongLen,iVar2 - (uint)this->MusHeader->SongStart);
        this->MaxMusP = (long)iVar1;
        (this->super_MIDIStreamer).Division = 0x8c;
        (this->super_MIDIStreamer).InitialTempo = 1000000;
      }
    }
  }
  return;
}

Assistant:

MUSSong2::MUSSong2 (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), MusBuffer(0)
{
#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif

	BYTE front[32];
	int start;

	if (reader.Read(front, sizeof(front)) != sizeof(front))
	{
		return;
	}

	// To tolerate sloppy wads (diescum.wad, I'm looking at you), we search
	// the first 32 bytes of the file for a signature. My guess is that DMX
	// does no validation whatsoever and just assumes it was passed a valid
	// MUS file, since where the header is offset affects how it plays.
	start = MUSHeaderSearch(front, sizeof(front));
	if (start < 0)
	{
		return;
	}

	// Read the remainder of the song.
	int len = int(reader.GetLength() - start);
	if (len < (int)sizeof(MusHeader))
	{ // It's too short.
		return;
	}
	MusHeader = (MUSHeader *)new BYTE[len];
    memcpy(MusHeader, front + start, sizeof(front) - start);
    if (reader.Read((BYTE *)MusHeader + sizeof(front) - start, len - (sizeof(front) - start)) != (len - (32 - start)))
    {
        return;
    }

	// Do some validation of the MUS file.
	if (LittleShort(MusHeader->NumChans) > 15)
	{
		return;
	}

	MusBuffer = (BYTE *)MusHeader + LittleShort(MusHeader->SongStart);
	MaxMusP = MIN<int>(LittleShort(MusHeader->SongLen), len - LittleShort(MusHeader->SongStart));
	Division = 140;
	InitialTempo = 1000000;
}